

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void __thiscall GEO::Stopwatch::~Stopwatch(Stopwatch *this)

{
  ostream *poVar1;
  double dVar2;
  Stopwatch *this_local;
  
  if ((this->verbose_ & 1U) != 0) {
    poVar1 = (ostream *)GEO::Logger::out((string *)this);
    poVar1 = std::operator<<(poVar1,"Elapsed time: ");
    dVar2 = (double)GEO::SystemStopwatch::elapsed_user_time();
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
    poVar1 = std::operator<<(poVar1," s");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Stopwatch() {
	    if(verbose_) {
		Logger::out(task_name_)
		    << "Elapsed time: " << W_.elapsed_user_time()
		    << " s" << std::endl;
	    }
        }